

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

Item * __thiscall WorldShuffler::randomize_fortune_teller_hint(WorldShuffler *this)

{
  RandomizerWorld *this_00;
  HintSource *hint_source;
  Item *item;
  Item *pIVar1;
  ostream *poVar2;
  char *__s;
  initializer_list<unsigned_char> __l;
  string local_200;
  string item_fancy_name;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hintable_items;
  stringstream fortune_teller_hint;
  size_type local_1a0;
  ostream local_198 [376];
  
  if (this->_options->_archipelago_world != false) {
    return (Item *)0x0;
  }
  this_00 = this->_world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fortune_teller_hint,"Mercator fortune teller",
             (allocator<char> *)&item_fancy_name);
  hint_source = RandomizerWorld::hint_source(this_00,(string *)&fortune_teller_hint);
  std::__cxx11::string::~string((string *)&fortune_teller_hint);
  RandomizerWorld::add_used_hint_source(this->_world,hint_source);
  HintSource::text_abi_cxx11_((string *)&fortune_teller_hint,hint_source);
  std::__cxx11::string::~string((string *)&fortune_teller_hint);
  if (local_1a0 != 0) {
    return (Item *)0x0;
  }
  _fortune_teller_hint = 0x3839372b;
  __l._M_len = 4;
  __l._M_array = (iterator)&fortune_teller_hint;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&hintable_items,__l,(allocator_type *)&item_fancy_name);
  vectools::shuffle<unsigned_char>(&hintable_items,&this->_rng);
  item = World::item(&this->_world->super_World,
                     *hintable_items.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  item_fancy_name._M_dataplus._M_p = (pointer)&item_fancy_name.field_2;
  item_fancy_name._M_string_length = 0;
  item_fancy_name.field_2._M_local_buf[0] = '\0';
  pIVar1 = World::item(&this->_world->super_World,'+');
  if (item == pIVar1) {
    __s = "an eye";
  }
  else {
    pIVar1 = World::item(&this->_world->super_World,'7');
    if (item == pIVar1) {
      __s = "a nail";
    }
    else {
      pIVar1 = World::item(&this->_world->super_World,'9');
      if (item == pIVar1) {
        __s = "a fang";
      }
      else {
        pIVar1 = World::item(&this->_world->super_World,'8');
        if (item != pIVar1) goto LAB_0017b199;
        __s = "a horn";
      }
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&item_fancy_name,__s);
LAB_0017b199:
  std::__cxx11::stringstream::stringstream((stringstream *)&fortune_teller_hint);
  poVar2 = std::operator<<(local_198,"\x1cI see... \x1aI see... \x1a\nI see ");
  poVar2 = std::operator<<(poVar2,(string *)&item_fancy_name);
  poVar2 = std::operator<<(poVar2," ");
  random_hint_for_item_abi_cxx11_(&local_200,this,item);
  poVar2 = std::operator<<(poVar2,(string *)&local_200);
  std::operator<<(poVar2,".");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&hint_source->_text,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  local_200._M_dataplus._M_p._0_1_ = item->_id;
  vectools::erase_first<unsigned_char>(&this->_hintable_item_locations,(uchar *)&local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&fortune_teller_hint);
  std::__cxx11::string::~string((string *)&item_fancy_name);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hintable_items.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return item;
}

Assistant:

Item* WorldShuffler::randomize_fortune_teller_hint()
{
    if(_options.archipelago_world())
        return nullptr;

    HintSource* fortune_teller_source = _world.hint_source("Mercator fortune teller");

    _world.add_used_hint_source(fortune_teller_source);

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!fortune_teller_source->text().empty())
        return nullptr;

    std::vector<uint8_t> hintable_items = { ITEM_GOLA_EYE, ITEM_GOLA_NAIL, ITEM_GOLA_FANG, ITEM_GOLA_HORN };
    vectools::shuffle(hintable_items, _rng);
    
    Item* hinted_item = _world.item(*(hintable_items.begin()));

    std::string item_fancy_name;
    if (hinted_item == _world.item(ITEM_GOLA_EYE))
        item_fancy_name = "an eye";
    else if (hinted_item == _world.item(ITEM_GOLA_NAIL))
        item_fancy_name = "a nail";
    else if (hinted_item == _world.item(ITEM_GOLA_FANG))
        item_fancy_name = "a fang";
    else if (hinted_item == _world.item(ITEM_GOLA_HORN))
        item_fancy_name = "a horn";

    std::stringstream fortune_teller_hint;
    fortune_teller_hint << "\x1cI see... \x1aI see... \x1a\nI see " << item_fancy_name << " " << this->random_hint_for_item(hinted_item) << ".";
    fortune_teller_source->text(fortune_teller_hint.str());

    vectools::erase_first(_hintable_item_locations, hinted_item->id());
    return hinted_item;
}